

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exampleThreadPool.cpp
# Opt level: O3

void __thiscall Source::operator()(Source *this)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  int iVar4;
  double dVar5;
  _Storage<double,_true> local_48;
  ulong local_40;
  double local_38;
  double local_30;
  
  iVar4 = 0;
  dVar5 = 0.0;
  do {
    local_30 = dVar5;
    uVar1 = std::uniform_int_distribution<int>::operator()(&distrib,&gen,&distrib._M_param);
    if (0 < (int)uVar1) {
      local_48 = (_Storage<double,_true>)((ulong)uVar1 / 1000);
      local_40 = ((ulong)uVar1 % 1000) * 1000000;
      do {
        iVar2 = nanosleep((timespec *)&local_48,(timespec *)&local_48);
        if (iVar2 != -1) break;
        piVar3 = __errno_location();
      } while (*piVar3 == 4);
    }
    local_38 = local_30 + 1.0;
    iVar4 = iVar4 + 1;
    local_48._M_value = local_30;
    local_40 = CONCAT71(local_40._1_7_,1);
    rtb::Concurrency::Queue<double>::push(this->outputQueue_,(optional<double> *)&local_48);
    dVar5 = local_38;
    if (iVar4 == 7) {
      local_40 = local_40 & 0xffffffffffffff00;
      rtb::Concurrency::Queue<double>::push(this->outputQueue_,(optional<double> *)&local_48);
      return;
    }
  } while( true );
}

Assistant:

void operator()() {
        int val = 0;
        for(int i{0}; i < 7; ++i) {
            std::this_thread::sleep_for(std::chrono::milliseconds(distrib(gen)));
            outputQueue_.push(val++);
        }
        outputQueue_.close();
    }